

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O2

idx_t duckdb::QuantileOperation::FrameSize<long>(QuantileIncluded<long> *included,SubFrames *frames)

{
  pointer pFVar1;
  bool bVar2;
  FrameBounds *frame;
  pointer pFVar3;
  idx_t iVar4;
  FrameBounds *frame_1;
  ulong local_30;
  
  if (((included->fmask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
       (unsigned_long *)0x0) && (included->dmask->all_valid == true)) {
    iVar4 = 0;
    for (pFVar3 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pFVar3 != (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pFVar3 = pFVar3 + 1) {
      iVar4 = (iVar4 + pFVar3->end) - pFVar3->start;
    }
  }
  else {
    pFVar1 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
             super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar4 = 0;
    for (pFVar3 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                  _M_impl.super__Vector_impl_data._M_start; pFVar3 != pFVar1; pFVar3 = pFVar3 + 1) {
      for (local_30 = pFVar3->start; local_30 < pFVar3->end; local_30 = local_30 + 1) {
        bVar2 = QuantileIncluded<long>::operator()(included,&local_30);
        iVar4 = iVar4 + bVar2;
      }
    }
  }
  return iVar4;
}

Assistant:

static idx_t FrameSize(QuantileIncluded<INPUT_TYPE> &included, const SubFrames &frames) {
		//	Count the number of valid values
		idx_t n = 0;
		if (included.AllValid()) {
			for (const auto &frame : frames) {
				n += frame.end - frame.start;
			}
		} else {
			//	NULLs or FILTERed values,
			for (const auto &frame : frames) {
				for (auto i = frame.start; i < frame.end; ++i) {
					n += included(i);
				}
			}
		}

		return n;
	}